

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O3

IOTHUB_CLIENT_RESULT
IoTHubTransport_MQTT_Common_SetOption(TRANSPORT_LL_HANDLE handle,char *option,void *value)

{
  IOTHUB_CREDENTIAL_TYPE IVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  LOGGER_LOG p_Var5;
  undefined1 rawBytesOn;
  IOTHUB_CLIENT_RESULT IVar6;
  undefined1 traceOn;
  MQTT_CLIENT_HANDLE handle_00;
  char *pcVar7;
  int *keepAliveOption;
  char *copied_proxy_username;
  char *copied_proxy_hostname;
  char *copied_proxy_password;
  char *local_48;
  char *local_40;
  char *local_38;
  
  if ((option == (char *)0x0 || handle == (TRANSPORT_LL_HANDLE)0x0) || value == (void *)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_INVALID_ARG;
    }
    pcVar7 = "invalid parameter (NULL) passed to IoTHubTransport_MQTT_Common_SetOption.";
    IVar6 = IOTHUB_CLIENT_INVALID_ARG;
    iVar2 = 0xe9e;
    goto LAB_0012d224;
  }
  IVar1 = IoTHubClient_Auth_Get_Credential_Type
                    (*(IOTHUB_AUTHORIZATION_HANDLE *)((long)handle + 0x118));
  iVar2 = strcmp("logtrace",option);
  if (iVar2 == 0) {
    traceOn = *value;
    *(undefined1 *)((long)handle + 0xb0) = traceOn;
    handle_00 = *(MQTT_CLIENT_HANDLE *)((long)handle + 0x70);
    rawBytesOn = *(undefined1 *)((long)handle + 0xb1);
LAB_0012d3cf:
    mqtt_client_set_trace(handle_00,(_Bool)traceOn,(_Bool)rawBytesOn);
    return IOTHUB_CLIENT_OK;
  }
  iVar2 = strcmp("rawlogtrace",option);
  if (iVar2 == 0) {
    rawBytesOn = *value;
    *(undefined1 *)((long)handle + 0xb1) = rawBytesOn;
    handle_00 = *(MQTT_CLIENT_HANDLE *)((long)handle + 0x70);
    traceOn = *(undefined1 *)((long)handle + 0xb0);
    goto LAB_0012d3cf;
  }
  iVar2 = strcmp("auto_url_encode_decode",option);
  if (iVar2 == 0) {
    *(undefined1 *)((long)handle + 0x108) = *value;
    return IOTHUB_CLIENT_OK;
  }
  iVar2 = strcmp("connect_timeout",option);
  if (iVar2 == 0) {
    if (*value != (uint)*(ushort *)((long)handle + 0x94)) {
      *(short *)((long)handle + 0x94) = (short)*value;
      return IOTHUB_CLIENT_OK;
    }
    return IOTHUB_CLIENT_OK;
  }
  iVar2 = strcmp("keepalive",option);
  if (iVar2 == 0) {
    if (*value == (uint)*(ushort *)((long)handle + 0x92)) {
      return IOTHUB_CLIENT_OK;
    }
    *(short *)((long)handle + 0x92) = (short)*value;
    if (*(int *)((long)handle + 0x88) != 0) {
      DisconnectFromClient((PMQTTTRANSPORT_HANDLE_DATA)handle);
      return IOTHUB_CLIENT_OK;
    }
    return IOTHUB_CLIENT_OK;
  }
  iVar2 = strcmp("x509certificate",option);
  if ((iVar2 == 0) && ((IVar1 & ~IOTHUB_CREDENTIAL_TYPE_X509) != IOTHUB_CREDENTIAL_TYPE_UNKNOWN)) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_INVALID_ARG;
    }
    pcVar7 = "x509certificate specified, but authentication method is not x509";
    IVar6 = IOTHUB_CLIENT_INVALID_ARG;
    iVar2 = 0xecf;
    goto LAB_0012d224;
  }
  iVar3 = strcmp("x509privatekey",option);
  if ((iVar3 == 0) && ((IVar1 & ~IOTHUB_CREDENTIAL_TYPE_X509) != IOTHUB_CREDENTIAL_TYPE_UNKNOWN)) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_INVALID_ARG;
    }
    pcVar7 = "x509privatekey specified, but authentication method is not x509";
    IVar6 = IOTHUB_CLIENT_INVALID_ARG;
    iVar2 = 0xed4;
    goto LAB_0012d224;
  }
  iVar4 = strcmp("retry_interval_sec",option);
  if (iVar4 == 0) {
    iVar2 = retry_control_set_option
                      (*(RETRY_CONTROL_HANDLE *)((long)handle + 0x110),"initial_wait_time_in_secs",
                       value);
    if (iVar2 == 0) {
      return IOTHUB_CLIENT_OK;
    }
    p_Var5 = xlogging_get_log_function();
    IVar6 = IOTHUB_CLIENT_ERROR;
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_ERROR;
    }
    pcVar7 = "Failure setting retry interval option";
    iVar2 = 0xedb;
    goto LAB_0012d224;
  }
  iVar4 = strcmp("retry_max_delay_secs",option);
  if (iVar4 == 0) {
    iVar2 = retry_control_set_option
                      (*(RETRY_CONTROL_HANDLE *)((long)handle + 0x110),"max_delay_in_secs",value);
    if (iVar2 == 0) {
      return IOTHUB_CLIENT_OK;
    }
    p_Var5 = xlogging_get_log_function();
    IVar6 = IOTHUB_CLIENT_ERROR;
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_ERROR;
    }
    pcVar7 = "Failure setting retry max delay option";
    iVar2 = 0xee7;
    goto LAB_0012d224;
  }
  iVar4 = strcmp("proxy_data",option);
  if (iVar4 != 0) {
    if (iVar2 == 0) {
      if (IVar1 == IOTHUB_CREDENTIAL_TYPE_X509) goto LAB_0012d371;
    }
    else if (iVar3 != 0 || IVar1 == IOTHUB_CREDENTIAL_TYPE_X509) goto LAB_0012d371;
    IoTHubClient_Auth_Set_x509_Type(*(IOTHUB_AUTHORIZATION_HANDLE *)((long)handle + 0x118),true);
LAB_0012d371:
    iVar2 = CreateTransportProviderIfNecessary((PMQTTTRANSPORT_HANDLE_DATA)handle);
    if (iVar2 == 0) {
      iVar2 = xio_setoption(*(XIO_HANDLE *)((long)handle + 0x78),option,value);
      return (uint)(iVar2 != 0);
    }
    return IOTHUB_CLIENT_ERROR;
  }
  if (*(long *)((long)handle + 0x78) != 0) {
    p_Var5 = xlogging_get_log_function();
    IVar6 = IOTHUB_CLIENT_ERROR;
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_ERROR;
    }
    pcVar7 = "Cannot set proxy option once the underlying IO is created";
    iVar2 = 0xef5;
    goto LAB_0012d224;
  }
  pcVar7 = *value;
  if (pcVar7 == (char *)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_INVALID_ARG;
    }
    pcVar7 = "NULL host_address in proxy options";
    IVar6 = IOTHUB_CLIENT_INVALID_ARG;
    iVar2 = 0xefa;
    goto LAB_0012d224;
  }
  if (*(long *)((long)value + 0x10) == 0) {
    if (*(long *)((long)value + 0x18) != 0) goto LAB_0012d65f;
  }
  else if (*(long *)((long)value + 0x18) == 0) {
LAB_0012d65f:
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_INVALID_ARG;
    }
    pcVar7 = "Only one of username and password for proxy settings was NULL";
    IVar6 = IOTHUB_CLIENT_INVALID_ARG;
    iVar2 = 0xf00;
    goto LAB_0012d224;
  }
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  local_38 = (char *)0x0;
  *(undefined4 *)((long)handle + 0x178) = *(undefined4 *)((long)value + 8);
  iVar2 = mallocAndStrcpy_s(&local_40,pcVar7);
  if (iVar2 == 0) {
    if ((*(char **)((long)value + 0x10) == (char *)0x0) ||
       (iVar2 = mallocAndStrcpy_s(&local_48,*(char **)((long)value + 0x10)), iVar2 == 0)) {
      if ((*(char **)((long)value + 0x18) == (char *)0x0) ||
         (iVar2 = mallocAndStrcpy_s(&local_38,*(char **)((long)value + 0x18)), iVar2 == 0)) {
        freeProxyData((MQTTTRANSPORT_HANDLE_DATA *)handle);
        *(char **)((long)handle + 0x170) = local_40;
        *(char **)((long)handle + 0x180) = local_48;
        *(char **)((long)handle + 0x188) = local_38;
        return IOTHUB_CLIENT_OK;
      }
      if (local_48 != (char *)0x0) {
        free(local_48);
      }
      free(local_40);
      p_Var5 = xlogging_get_log_function();
      IVar6 = IOTHUB_CLIENT_ERROR;
      if (p_Var5 == (LOGGER_LOG)0x0) {
        return IOTHUB_CLIENT_ERROR;
      }
      pcVar7 = "Cannot copy HTTP proxy password";
      iVar2 = 0xf1c;
    }
    else {
      free(local_40);
      p_Var5 = xlogging_get_log_function();
      IVar6 = IOTHUB_CLIENT_ERROR;
      if (p_Var5 == (LOGGER_LOG)0x0) {
        return IOTHUB_CLIENT_ERROR;
      }
      pcVar7 = "Cannot copy HTTP proxy username";
      iVar2 = 0xf12;
    }
  }
  else {
    p_Var5 = xlogging_get_log_function();
    IVar6 = IOTHUB_CLIENT_ERROR;
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_ERROR;
    }
    pcVar7 = "Cannot copy HTTP proxy hostname";
    iVar2 = 0xf0c;
  }
LAB_0012d224:
  (*p_Var5)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
            ,"IoTHubTransport_MQTT_Common_SetOption",iVar2,1,pcVar7);
  return IVar6;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubTransport_MQTT_Common_SetOption(TRANSPORT_LL_HANDLE handle, const char* option, const void* value)
{
    IOTHUB_CLIENT_RESULT result;
    if (
        (handle == NULL) ||
        (option == NULL) ||
        (value == NULL)
        )
    {
        result = IOTHUB_CLIENT_INVALID_ARG;
        LogError("invalid parameter (NULL) passed to IoTHubTransport_MQTT_Common_SetOption.");
    }
    else
    {
        MQTTTRANSPORT_HANDLE_DATA* transport_data = (MQTTTRANSPORT_HANDLE_DATA*)handle;

        IOTHUB_CREDENTIAL_TYPE cred_type = IoTHubClient_Auth_Get_Credential_Type(transport_data->authorization_module);

        if (strcmp(OPTION_LOG_TRACE, option) == 0)
        {
            transport_data->log_trace = *((bool*)value);
            mqtt_client_set_trace(transport_data->mqttClient, transport_data->log_trace, transport_data->raw_trace);
            result = IOTHUB_CLIENT_OK;
        }
        else if (strcmp("rawlogtrace", option) == 0)
        {
            transport_data->raw_trace = *((bool*)value);
            mqtt_client_set_trace(transport_data->mqttClient, transport_data->log_trace, transport_data->raw_trace);
            result = IOTHUB_CLIENT_OK;
        }
        else if (strcmp(OPTION_AUTO_URL_ENCODE_DECODE, option) == 0)
        {
            transport_data->auto_url_encode_decode = *((bool*)value);
            result = IOTHUB_CLIENT_OK;
        }
        else if (strcmp(OPTION_CONNECTION_TIMEOUT, option) == 0)
        {
            int* connection_time = (int*)value;
            if (*connection_time != transport_data->connect_timeout_in_sec)
            {
                transport_data->connect_timeout_in_sec = (uint16_t)(*connection_time);
            }
            result = IOTHUB_CLIENT_OK;
        }
        else if (strcmp(OPTION_KEEP_ALIVE, option) == 0)
        {
            int* keepAliveOption = (int*)value;
            if (*keepAliveOption != transport_data->keepAliveValue)
            {
                transport_data->keepAliveValue = (uint16_t)(*keepAliveOption);
                if (transport_data->mqttClientStatus != MQTT_CLIENT_STATUS_NOT_CONNECTED)
                {
                    DisconnectFromClient(transport_data);
                }
            }
            result = IOTHUB_CLIENT_OK;
        }
        else if ((strcmp(OPTION_X509_CERT, option) == 0) && (cred_type != IOTHUB_CREDENTIAL_TYPE_X509 && cred_type != IOTHUB_CREDENTIAL_TYPE_UNKNOWN))
        {
            LogError("x509certificate specified, but authentication method is not x509");
            result = IOTHUB_CLIENT_INVALID_ARG;
        }
        else if ((strcmp(OPTION_X509_PRIVATE_KEY, option) == 0) && (cred_type != IOTHUB_CREDENTIAL_TYPE_X509 && cred_type != IOTHUB_CREDENTIAL_TYPE_UNKNOWN))
        {
            LogError("x509privatekey specified, but authentication method is not x509");
            result = IOTHUB_CLIENT_INVALID_ARG;
        }
        else if (strcmp(OPTION_RETRY_INTERVAL_SEC, option) == 0)
        {
            if (retry_control_set_option(transport_data->retry_control_handle, RETRY_CONTROL_OPTION_INITIAL_WAIT_TIME_IN_SECS, value) != 0)
            {
                LogError("Failure setting retry interval option");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = IOTHUB_CLIENT_OK;
            }
        }
        else if (strcmp(OPTION_RETRY_MAX_DELAY_SECS, option) == 0)
        {
            if (retry_control_set_option(transport_data->retry_control_handle, RETRY_CONTROL_OPTION_MAX_DELAY_IN_SECS, value) != 0)
            {
                LogError("Failure setting retry max delay option");
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = IOTHUB_CLIENT_OK;
            }
        }
        else if (strcmp(OPTION_HTTP_PROXY, option) == 0)
        {
            HTTP_PROXY_OPTIONS* proxy_options = (HTTP_PROXY_OPTIONS*)value;

            if (transport_data->xioTransport != NULL)
            {
                LogError("Cannot set proxy option once the underlying IO is created");
                result = IOTHUB_CLIENT_ERROR;
            }
            else if (proxy_options->host_address == NULL)
            {
                LogError("NULL host_address in proxy options");
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else if (((proxy_options->username == NULL) || (proxy_options->password == NULL)) &&
                (proxy_options->username != proxy_options->password))
            {
                LogError("Only one of username and password for proxy settings was NULL");
                result = IOTHUB_CLIENT_INVALID_ARG;
            }
            else
            {
                char* copied_proxy_hostname = NULL;
                char* copied_proxy_username = NULL;
                char* copied_proxy_password = NULL;

                transport_data->http_proxy_port = proxy_options->port;
                if (mallocAndStrcpy_s(&copied_proxy_hostname, proxy_options->host_address) != 0)
                {
                    LogError("Cannot copy HTTP proxy hostname");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else if ((proxy_options->username != NULL) && (mallocAndStrcpy_s(&copied_proxy_username, proxy_options->username) != 0))
                {
                    free(copied_proxy_hostname);
                    LogError("Cannot copy HTTP proxy username");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else if ((proxy_options->password != NULL) && (mallocAndStrcpy_s(&copied_proxy_password, proxy_options->password) != 0))
                {
                    if (copied_proxy_username != NULL)
                    {
                        free(copied_proxy_username);
                    }
                    free(copied_proxy_hostname);
                    LogError("Cannot copy HTTP proxy password");
                    result = IOTHUB_CLIENT_ERROR;
                }
                else
                {
                    freeProxyData(transport_data);

                    transport_data->http_proxy_hostname = copied_proxy_hostname;
                    transport_data->http_proxy_username = copied_proxy_username;
                    transport_data->http_proxy_password = copied_proxy_password;

                    result = IOTHUB_CLIENT_OK;
                }
            }
        }
        else
        {
            if (((strcmp(OPTION_X509_CERT, option) == 0) || (strcmp(OPTION_X509_PRIVATE_KEY, option) == 0)) && (cred_type != IOTHUB_CREDENTIAL_TYPE_X509))
            {
                IoTHubClient_Auth_Set_x509_Type(transport_data->authorization_module, true);
            }

            if (CreateTransportProviderIfNecessary(transport_data) == 0)
            {
                if (xio_setoption(transport_data->xioTransport, option, value) == 0)
                {
                    result = IOTHUB_CLIENT_OK;
                }
                else
                {
                    result = IOTHUB_CLIENT_INVALID_ARG;
                }
            }
            else
            {
                result = IOTHUB_CLIENT_ERROR;
            }
        }
    }
    return result;
}